

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O3

void deqp::gles3::Functional::eval_selection_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Vector<unsigned_int,_4> res;
  
  fVar1 = c->in[1].m_data[0];
  fVar2 = c->in[1].m_data[1];
  fVar3 = c->in[1].m_data[2];
  fVar4 = c->in[1].m_data[3];
  uVar5 = (uint)fVar1;
  uVar6 = (uint)fVar2;
  uVar7 = (uint)fVar3;
  uVar8 = (uint)fVar4;
  uVar5 = (int)uVar5 >> 0x1f & (int)(fVar1 - 2.1474836e+09) | uVar5;
  uVar6 = (int)uVar6 >> 0x1f & (int)(fVar2 - 2.1474836e+09) | uVar6;
  uVar7 = (int)uVar7 >> 0x1f & (int)(fVar3 - 2.1474836e+09) | uVar7;
  uVar8 = (int)uVar8 >> 0x1f & (int)(fVar4 - 2.1474836e+09) | uVar8;
  if (c->in[0].m_data[2] <= 0.0) {
    fVar1 = c->in[2].m_data[0];
    fVar2 = c->in[2].m_data[1];
    fVar3 = c->in[2].m_data[2];
    fVar4 = c->in[2].m_data[3];
    uVar8 = (uint)fVar1;
    uVar5 = (uint)fVar2;
    uVar6 = (uint)fVar3;
    uVar7 = (uint)fVar4;
    uVar8 = (int)uVar8 >> 0x1f & (int)(fVar1 - 2.1474836e+09) | uVar8;
    uVar5 = (int)uVar5 >> 0x1f & (int)(fVar2 - 2.1474836e+09) | uVar5;
    uVar6 = (int)uVar6 >> 0x1f & (int)(fVar3 - 2.1474836e+09) | uVar6;
    uVar7 = (int)uVar7 >> 0x1f & (int)(fVar4 - 2.1474836e+09) | uVar7;
  }
  (c->color).m_data[0] =
       ((float)(uVar8 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar8 & 0xffff | 0x4b000000);
  (c->color).m_data[1] =
       ((float)(uVar7 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar7 & 0xffff | 0x4b000000);
  (c->color).m_data[2] =
       ((float)(uVar6 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar6 & 0xffff | 0x4b000000);
  (c->color).m_data[3] =
       ((float)(uVar5 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar5 & 0xffff | 0x4b000000);
  return;
}

Assistant:

void eval_selection_uvec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(3, 2, 1, 0).asUint(),	c.in[2].swizzle(0, 3, 2, 1).asUint()).asFloat(); }